

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label.cpp
# Opt level: O2

optional<jhu::thrax::(anonymous_namespace)::Concat> *
jhu::thrax::anon_unknown_0::concatenation
          (optional<jhu::thrax::(anonymous_namespace)::Concat> *__return_storage_ptr__,Tree *tree,
          Span nt)

{
  size_t sVar1;
  char *pcVar2;
  __normal_iterator<const_jhu::thrax::Node_*,_std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>_>
  _Var3;
  pair<__gnu_cxx::__normal_iterator<const_jhu::thrax::Node_*,_std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>_>,___gnu_cxx::__normal_iterator<const_jhu::thrax::Node_*,_std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>_>_>
  pVar4;
  optional<jhu::thrax::(anonymous_namespace)::Constituent> b;
  _Storage<jhu::thrax::(anonymous_namespace)::Constituent,_true> local_70;
  char local_60;
  Span local_58;
  undefined4 uStack_54;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  _local_58 = CONCAT44(uStack_54,nt);
  uStack_50 = 0;
  uStack_48 = 0;
  uStack_40 = 0;
  pVar4 = std::
          equal_range<__gnu_cxx::__normal_iterator<jhu::thrax::Node_const*,std::vector<jhu::thrax::Node,std::allocator<jhu::thrax::Node>>>,jhu::thrax::Node,jhu::thrax::(anonymous_namespace)::__1>
                    ((tree->super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>)
                     ._M_impl.super__Vector_impl_data._M_start,
                     (tree->super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>)
                     ._M_impl.super__Vector_impl_data._M_finish);
  _Var3 = pVar4.first._M_current;
  while( true ) {
    if (pVar4.second._M_current._M_current <= _Var3._M_current) {
      (__return_storage_ptr__->
      super__Optional_base<jhu::thrax::(anonymous_namespace)::Concat,_true,_true>)._M_payload.
      super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Concat>._M_engaged = false;
      return __return_storage_ptr__;
    }
    constituent((optional<jhu::thrax::(anonymous_namespace)::Constituent> *)&local_70._M_value,tree,
                (Span)((uint)(ushort)((_Var3._M_current)->span).end | (uint)nt & 0xffff0000));
    if (local_60 == '\x01') break;
    _Var3._M_current = _Var3._M_current + 1;
  }
  sVar1 = ((_Var3._M_current)->label)._M_len;
  pcVar2 = ((_Var3._M_current)->label)._M_str;
  (__return_storage_ptr__->
  super__Optional_base<jhu::thrax::(anonymous_namespace)::Concat,_true,_true>)._M_payload.
  super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Concat>._M_payload._M_value.b.
  _M_len = local_70._M_value.label._M_len;
  (__return_storage_ptr__->
  super__Optional_base<jhu::thrax::(anonymous_namespace)::Concat,_true,_true>)._M_payload.
  super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Concat>._M_payload._M_value.b.
  _M_str = local_70._M_value.label._M_str;
  (__return_storage_ptr__->
  super__Optional_base<jhu::thrax::(anonymous_namespace)::Concat,_true,_true>)._M_payload.
  super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Concat>._M_payload._M_value.a.
  _M_len = sVar1;
  (__return_storage_ptr__->
  super__Optional_base<jhu::thrax::(anonymous_namespace)::Concat,_true,_true>)._M_payload.
  super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Concat>._M_payload._M_value.a.
  _M_str = pcVar2;
  (__return_storage_ptr__->
  super__Optional_base<jhu::thrax::(anonymous_namespace)::Concat,_true,_true>)._M_payload.
  super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Concat>._M_engaged = true;
  return __return_storage_ptr__;
}

Assistant:

std::optional<Concat> concatenation(const Tree& tree, Span nt) {
  auto [s, e] = std::equal_range(
      tree.begin(), tree.end(), Node{ nt, {}, nullptr }, byStart);
  for (auto it = s; it < e; it++) {
    auto b = constituent(tree, Span{ it->span.end, nt.end });
    if (b.has_value()) {
      return Concat{ it->label, b->label };
    }
  }
  return {};
}